

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O0

void JitFFI::OpCode_x64::_push_pop_base<(unsigned_char)143,(unsigned_char)88,(unsigned_char)0>
               (JitFuncCreater *jfc,Register src)

{
  bool bVar1;
  byte bVar2;
  Register src_local;
  JitFuncCreater *jfc_local;
  
  bVar1 = is_rxq0(src);
  if (bVar1) {
    bVar2 = get_code(src);
    JitFuncCreater::push(jfc,bVar2 + 'X');
  }
  else {
    bVar1 = is_rxq1(src);
    if (bVar1) {
      bVar2 = get_code(src);
      JitFuncCreater::push(jfc,'A',bVar2 + 'X');
    }
    else {
      bVar1 = is_prxq(src);
      if (!bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                      ,0x1dc,
                      "void JitFFI::OpCode_x64::_push_pop_base(JitFuncCreater &, Register) [PreCode = (unsigned char)\'\\x8f\', V1 = (unsigned char)\'X\', V2 = (unsigned char)\'\\x00\']"
                     );
      }
      if ((src == prbp) || (src == pr13)) {
        bVar2 = get_code(src);
        JitFuncCreater::push(jfc,0x8f,bVar2 + '@','\0');
      }
      else {
        bVar1 = is_prxq0(src);
        if (bVar1) {
          bVar2 = get_code(src);
          JitFuncCreater::push(jfc,0x8f,bVar2);
        }
        else {
          bVar2 = get_code(src);
          JitFuncCreater::push(jfc,'A',0x8f,bVar2);
        }
        if ((src == prsp) || (src == pr12)) {
          JitFuncCreater::push(jfc,'$');
        }
      }
    }
  }
  return;
}

Assistant:

inline void _push_pop_base(JitFuncCreater &jfc, Register src) {
			if (is_rxq0(src))
				jfc.push(V1 + get_code(src));
			else if (is_rxq1(src))
				jfc.push(0x41, V1 + get_code(src));
			else if (is_prxq(src)) {
				if (src == prbp || src == pr13) {
					jfc.push(PreCode, V2 + 0100 + get_code(src), 0x00);
				}
				else {
					if (is_prxq0(src))
						jfc.push(PreCode, V2 + get_code(src));
					else
						jfc.push(0x41, PreCode, V2 + get_code(src));
					if (src == prsp || src == pr12)
						jfc.push(0x24);
				}
			}
			else
				assert(false);
		}